

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::_InternalSerialize
          (GeneratedCodeInfo_Annotation *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  string_view s;
  GeneratedCodeInfo_Annotation *pGVar1;
  EpsCopyOutputStream *pEVar2;
  bool bVar3;
  int iVar4;
  int32_t iVar5;
  GeneratedCodeInfo_Annotation_Semantic value;
  LogMessage *pLVar6;
  const_pointer piVar7;
  uint32_t *puVar8;
  char *data;
  UnknownFieldSet *unknown_fields;
  string_view local_130;
  string *local_120;
  string *_s;
  int byte_size;
  uint32_t cached_has_bits;
  GeneratedCodeInfo_Annotation *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  GeneratedCodeInfo_Annotation *this_local;
  uint local_e4;
  RepeatedField<int> *local_e0;
  undefined4 local_d4;
  GeneratedCodeInfo_Annotation *local_d0;
  const_pointer local_c8;
  const_pointer end;
  const_pointer it;
  EpsCopyOutputStream *local_b0;
  uint local_a4;
  RepeatedField<int> *local_a0;
  int local_94;
  GeneratedCodeInfo_Annotation *local_90;
  EpsCopyOutputStream *local_88;
  ulong local_80;
  _func_int **local_78;
  uint local_70;
  int local_6c;
  GeneratedCodeInfo_Annotation *local_68;
  byte local_59;
  LogMessage local_58;
  Voidify local_41;
  _func_int **local_40;
  uint local_38;
  int local_34;
  GeneratedCodeInfo_Annotation *local_30;
  _func_int **local_28;
  uint local_1c;
  EpsCopyOutputStream *local_18;
  uint local_c;
  
  _s._4_4_ = 0;
  _byte_size = this;
  this_ = (GeneratedCodeInfo_Annotation *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  _s._0_4_ = internal::CachedSize::Get(&(this->field_0)._impl_._path_cached_byte_size_);
  pGVar1 = this_;
  pEVar2 = stream_local;
  if (0 < (int)(uint)_s) {
    local_e0 = _internal_path(_byte_size);
    local_d0 = pGVar1;
    local_d4 = 1;
    local_e4 = (uint)_s;
    this_local = (GeneratedCodeInfo_Annotation *)stream_local;
    local_90 = pGVar1;
    local_94 = 1;
    local_a4 = (uint)_s;
    local_b0 = stream_local;
    it = (const_pointer)io::EpsCopyOutputStream::Encode64;
    local_a0 = local_e0;
    local_b0 = (EpsCopyOutputStream *)
               io::EpsCopyOutputStream::EnsureSpace
                         ((EpsCopyOutputStream *)pGVar1,(uint8_t *)stream_local);
    local_68 = pGVar1;
    local_6c = local_94;
    local_70 = local_a4;
    local_30 = pGVar1;
    local_34 = local_94;
    local_38 = 2;
    local_59 = 0;
    local_78 = (_func_int **)local_b0;
    local_40 = (_func_int **)local_b0;
    if ((pGVar1->super_Message).super_MessageLite._vptr_MessageLite <= local_b0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_59 = 1;
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar6);
    }
    if ((local_59 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    }
    local_28 = local_40;
    for (local_1c = local_34 << 3 | local_38; 0x7f < local_1c; local_1c = local_1c >> 7) {
      *(byte *)local_28 = (byte)local_1c | 0x80;
      local_28 = (_func_int **)((long)local_28 + 1);
    }
    local_78 = (_func_int **)((long)local_28 + 1);
    *(byte *)local_28 = (byte)local_1c;
    local_18 = (EpsCopyOutputStream *)local_78;
    for (local_c = local_70; 0x7f < local_c; local_c = local_c >> 7) {
      *(byte *)local_18 = (byte)local_c | 0x80;
      local_18 = (EpsCopyOutputStream *)((long)local_18 + 1);
    }
    local_b0 = (EpsCopyOutputStream *)((long)local_18 + 1);
    *(byte *)local_18 = (byte)local_c;
    local_28 = local_78;
    local_18 = local_b0;
    piVar7 = RepeatedField<int>::data(local_a0);
    end = piVar7;
    iVar4 = RepeatedField<int>::size(local_a0);
    local_c8 = piVar7 + iVar4;
    do {
      local_b0 = (EpsCopyOutputStream *)
                 io::EpsCopyOutputStream::EnsureSpace
                           ((EpsCopyOutputStream *)pGVar1,(uint8_t *)local_b0);
      iVar4 = *end;
      end = end + 1;
      local_80 = (*(code *)it)((long)iVar4);
      local_88 = local_b0;
      for (; 0x7f < local_80; local_80 = local_80 >> 7) {
        *(byte *)local_88 = (byte)local_80 | 0x80;
        local_88 = (EpsCopyOutputStream *)((long)local_88 + 1);
      }
      local_b0 = (EpsCopyOutputStream *)((long)local_88 + 1);
      *(byte *)local_88 = (byte)local_80;
      pEVar2 = local_b0;
      local_88 = local_b0;
    } while (end < local_c8);
  }
  stream_local = pEVar2;
  puVar8 = internal::HasBits<1>::operator[](&(_byte_size->field_0)._impl_._has_bits_,0);
  _s._4_4_ = *puVar8;
  if ((_s._4_4_ & 1) != 0) {
    local_120 = _internal_source_file_abi_cxx11_(_byte_size);
    data = (char *)std::__cxx11::string::data();
    iVar4 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_130,"google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    internal::WireFormat::VerifyUTF8StringNamedField(data,iVar4,SERIALIZE,local_130);
    pGVar1 = this_;
    s = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_120);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pGVar1,2,s,(uint8_t *)stream_local);
  }
  pGVar1 = this_;
  if ((_s._4_4_ & 2) != 0) {
    iVar5 = _internal_begin(_byte_size);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                             ((EpsCopyOutputStream *)pGVar1,iVar5,(uint8_t *)stream_local);
  }
  pGVar1 = this_;
  if ((_s._4_4_ & 4) != 0) {
    iVar5 = _internal_end(_byte_size);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteInt32ToArrayWithField<4>
                             ((EpsCopyOutputStream *)pGVar1,iVar5,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 8) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    value = _internal_semantic(_byte_size);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(5,value,(uint8_t *)stream_local);
  }
  bVar3 = internal::InternalMetadata::have_unknown_fields
                    (&(_byte_size->super_Message).super_MessageLite._internal_metadata_);
  if (bVar3) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(_byte_size->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL GeneratedCodeInfo_Annotation::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const GeneratedCodeInfo_Annotation& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.GeneratedCodeInfo.Annotation)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    int byte_size = this_._impl_._path_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, this_._internal_path(), byte_size, target);
    }
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string source_file = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_source_file();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // optional int32 begin = 3;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_begin(), target);
  }

  // optional int32 end = 4;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<4>(
            stream, this_._internal_end(), target);
  }

  // optional .google.protobuf.GeneratedCodeInfo.Annotation.Semantic semantic = 5;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        5, this_._internal_semantic(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.GeneratedCodeInfo.Annotation)
  return target;
}